

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O0

void do_cmd_throw(command_conflict *cmd)

{
  player_body body;
  _Bool _Var1;
  int16_t iVar2;
  wchar_t wVar3;
  wchar_t local_40;
  int local_3c;
  object *local_38;
  object *obj;
  wchar_t range;
  wchar_t weight;
  ranged_attack attack;
  wchar_t local_18;
  wchar_t str;
  wchar_t shots;
  wchar_t dir;
  command_conflict *cmd_local;
  
  local_18 = L'\n';
  attack._4_4_ = adj_str_blow[(player->state).stat_ind[0]];
  _range = make_ranged_throw;
  _shots = cmd;
  _Var1 = player_get_resume_normal_shape(player,cmd);
  if (_Var1) {
    if (player->upkeep->command_wrk == L'\x01') {
      player->upkeep->command_wrk = L'\x02';
    }
    wVar3 = cmd_get_item((command *)_shots,"item",&local_38,"Throw which item?",
                         "You have nothing to throw.",obj_can_throw,L'ࠏ');
    if ((wVar3 == L'\0') &&
       (wVar3 = cmd_get_target((command *)_shots,"target",&str), wVar3 == L'\0')) {
      player_confuse_dir(player,&str,false);
      body.name._4_4_ = (int)((ulong)(player->body).name >> 0x20);
      body._0_12_ = *(undefined1 (*) [12])&player->body;
      body.count = (player->body).count;
      body._18_6_ = *(undefined6 *)&(player->body).field_0x12;
      body.slots = (player->body).slots;
      _Var1 = object_is_equipped(body,local_38);
      if (_Var1) {
        _Var1 = obj_can_takeoff(local_38);
        if ((!_Var1) || (_Var1 = tval_is_melee_weapon(local_38), !_Var1)) {
          __assert_fail("obj_can_takeoff(obj) && tval_is_melee_weapon(obj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-attack.c"
                        ,0x576,"void do_cmd_throw(struct command *)");
        }
        inven_takeoff(local_38);
      }
      iVar2 = object_weight_one(local_38);
      if (iVar2 < 10) {
        local_3c = 10;
      }
      else {
        iVar2 = object_weight_one(local_38);
        local_3c = (int)iVar2;
      }
      obj._4_4_ = local_3c;
      if (((attack._4_4_ + 0x14) * 10) / local_3c < 0xb) {
        local_40 = ((attack._4_4_ + 0x14) * 10) / local_3c;
      }
      else {
        local_40 = L'\n';
      }
      obj._0_4_ = local_40;
      ranged_helper(player,local_38,str,local_40,local_18,_range,ranged_hit_types,L'\x05');
    }
  }
  return;
}

Assistant:

void do_cmd_throw(struct command *cmd) {
	int dir;
	int shots = 10;
	int str = adj_str_blow[player->state.stat_ind[STAT_STR]];
	ranged_attack attack = make_ranged_throw;

	int weight;
	int range;
	struct object *obj;

	if (!player_get_resume_normal_shape(player, cmd)) {
		return;
	}

	/*
	 * Get arguments.  Never default to showing the equipment as the first
	 * list (since throwing the equipped weapon leaves that slot empty will
	 * have to choose another source anyways).
	 */
	if (player->upkeep->command_wrk == USE_EQUIP)
		player->upkeep->command_wrk = USE_INVEN;
	if (cmd_get_item(cmd, "item", &obj,
			/* Prompt */ "Throw which item?",
			/* Error  */ "You have nothing to throw.",
			/* Filter */ obj_can_throw,
			/* Choice */ USE_EQUIP | USE_QUIVER | USE_INVEN | USE_FLOOR | SHOW_THROWING)
		!= CMD_OK)
		return;

	if (cmd_get_target(cmd, "target", &dir) == CMD_OK)
		player_confuse_dir(player, &dir, false);
	else
		return;

	if (object_is_equipped(player->body, obj)) {
		assert(obj_can_takeoff(obj) && tval_is_melee_weapon(obj));
		inven_takeoff(obj);
	}

	weight = MAX(object_weight_one(obj), 10);
	range = MIN(((str + 20) * 10) / weight, 10);

	ranged_helper(player, obj, dir, range, shots, attack, ranged_hit_types,
				  (int) N_ELEMENTS(ranged_hit_types));
}